

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmlst.cpp
# Opt level: O2

int CVmObjList::getp_index_of(vm_val_t *retval,vm_val_t *self_val,char *lst,uint *argc)

{
  int iVar1;
  size_t idx;
  vm_val_t subval;
  
  if (getp_index_of(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*)::desc == '\0') {
    iVar1 = __cxa_guard_acquire(&getp_index_of(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*)
                                 ::desc);
    if (iVar1 != 0) {
      getp_index_of::desc.min_argc_ = 1;
      getp_index_of::desc.opt_argc_ = 0;
      getp_index_of::desc.varargs_ = 0;
      __cxa_guard_release(&getp_index_of(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*)::desc)
      ;
    }
  }
  iVar1 = CVmObject::get_prop_check_argc(retval,argc,&getp_index_of::desc);
  if (iVar1 == 0) {
    subval.typ = sp_[-1].typ;
    subval._4_4_ = *(undefined4 *)&sp_[-1].field_0x4;
    subval.val = sp_[-1].val;
    sp_ = sp_ + -1;
    iVar1 = find_in_list(self_val,&subval,&idx);
    if (iVar1 == 0) {
      retval->typ = VM_NIL;
    }
    else {
      retval->typ = VM_INT;
      (retval->val).obj = (vm_obj_id_t)idx;
    }
  }
  return 1;
}

Assistant:

int CVmObjList::getp_index_of(VMG_ vm_val_t *retval, const vm_val_t *self_val,
                              const char *lst, uint *argc)
{
    vm_val_t subval;
    size_t idx;
    static CVmNativeCodeDesc desc(1);

    /* check arguments */
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* pop the value to find */
    G_stk->pop(&subval);

    /* find the value in the list */
    if (find_in_list(vmg_ self_val, &subval, &idx))
    {
        /* found it - adjust to 1-based index for return */
        retval->set_int(idx);
    }
    else
    {
        /* didn't find it - return nil */
        retval->set_nil();
    }

    /* handled */
    return TRUE;
}